

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

int __thiscall
booster::locale::impl_icu::calendar_impl::get_option(calendar_impl *this,calendar_option_type opt)

{
  char cVar1;
  Calendar *pCVar2;
  int in_ESI;
  long in_RDI;
  bool bVar3;
  bool res;
  UErrorCode err;
  guard l;
  mutex_type *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  long local_58;
  undefined4 local_2c [3];
  UErrorCode *in_stack_ffffffffffffffe0;
  uint local_4;
  
  if (in_ESI == 0) {
    pCVar2 = hold_ptr<icu_70::Calendar>::get((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50));
    if (pCVar2 == (Calendar *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = __dynamic_cast(pCVar2,&icu_70::Calendar::typeinfo,
                                &icu_70::GregorianCalendar::typeinfo,0);
    }
    local_4 = (uint)(local_58 != 0);
  }
  else if (in_ESI == 1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    local_2c[0] = 0;
    pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50));
    cVar1 = (**(code **)(*(long *)pCVar2 + 0x60))(pCVar2,local_2c);
    bVar3 = cVar1 != '\0';
    check_and_throw_dt(in_stack_ffffffffffffffe0);
    local_4 = (uint)bVar3;
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)CONCAT17(cVar1,in_stack_ffffffffffffffa0));
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

virtual int get_option(calendar_option_type opt) const
        {
            switch(opt) {
            case is_gregorian:
                return dynamic_cast<icu::GregorianCalendar const *>(calendar_.get())!=0;
            case is_dst:
                {
                    guard l(lock_);
                    UErrorCode err = U_ZERO_ERROR;
                    bool res = ( calendar_->inDaylightTime(err) != 0 );
                    check_and_throw_dt(err);
                    return res;
                }
            default:
                return 0;
            }
        }